

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonBondedInteractionType.cpp
# Opt level: O3

void __thiscall
OpenMD::NonBondedInteractionType::NonBondedInteractionType(NonBondedInteractionType *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_NonBondedInteractionType = (_func_int **)&PTR__NonBondedInteractionType_002aa3e8;
  (this->properties_)._vptr_PropertyMap = (_func_int **)&PTR__PropertyMap_002a82c8;
  p_Var1 = &(this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->nbitp).is_RepulsivePower = false;
  (this->nbitp).is_Mie = false;
  (this->nbitp).is_Buckingham = false;
  (this->nbitp).is_InversePowerSeries = false;
  (this->nbitp).is_LennardJones = false;
  (this->nbitp).is_Morse = false;
  (this->nbitp).is_MAW = false;
  (this->nbitp).is_EAMTable = false;
  (this->nbitp).is_EAMZhou = false;
  (this->nbitp).is_EAMOxides = false;
  (this->nbitp).is_SC = false;
  (this->nbitp).is_RepulsivePower = false;
  (this->atomTypes_).first = (AtomType *)0x0;
  (this->atomTypes_).second = (AtomType *)0x0;
  return;
}

Assistant:

NonBondedInteractionType::NonBondedInteractionType() {
    nbitp.is_LennardJones       = false;
    nbitp.is_Morse              = false;
    nbitp.is_MAW                = false;
    nbitp.is_EAMTable           = false;
    nbitp.is_EAMZhou            = false;
    nbitp.is_EAMOxides          = false;
    nbitp.is_SC                 = false;
    nbitp.is_RepulsivePower     = false;
    nbitp.is_Mie                = false;
    nbitp.is_Buckingham         = false;
    nbitp.is_InversePowerSeries = false;
    atomTypes_.first            = NULL;
    atomTypes_.second           = NULL;
  }